

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *__ptr;
  long *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Layer *pLVar9;
  long lVar10;
  ParamDict pd;
  Option opt;
  Mat local_118;
  ParamDict local_c8;
  Mat local_b8;
  void *local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  int local_58;
  Allocator *local_50;
  int iStack_48;
  int iStack_44;
  int iStack_40;
  undefined8 uStack_3c;
  size_t local_30;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar9 = create_layer(3);
    ParamDict::ParamDict(&local_c8);
    ParamDict::set(&local_c8,0,this->c);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_c8);
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_b8.data = local_118.data;
    local_b8.refcount._0_4_ = local_118.refcount._0_4_;
    local_b8.refcount._4_4_ = local_118.refcount._4_4_;
    local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
    local_b8.elempack = local_118.elempack;
    local_b8.allocator = local_118.allocator;
    local_b8.dims = local_118.dims;
    local_b8.w = local_118.w;
    local_b8.h = local_118.h;
    uVar7._0_4_ = local_118.d;
    uVar7._4_4_ = local_118.c;
    local_b8.d = local_118.d;
    local_b8.c = local_118.c;
    local_b8.cstep = local_118.cstep;
    uVar8 = uVar7;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      uVar8 = local_b8._52_8_;
      if (*piVar3 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            local_b8._52_8_ = uVar7;
            free(local_118.data);
            uVar8 = local_b8._52_8_;
          }
        }
        else {
          local_b8._52_8_ = uVar7;
          (*(local_118.allocator)->_vptr_Allocator[3])();
          uVar8 = local_b8._52_8_;
        }
      }
    }
    local_b8._52_8_ = uVar8;
    iVar2 = this->c;
    if (0 < (long)iVar2) {
      lVar10 = 0;
      do {
        *(float *)((long)local_b8.data + lVar10 * 4) = -mean_vals[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
    (*pLVar9->_vptr_Layer[3])(pLVar9,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar3 == (int *)0x0) goto LAB_0015aa3d;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0015aa3d;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0015aa3d;
    }
  }
  else {
    if (mean_vals != (float *)0x0 || norm_vals == (float *)0x0) {
      if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
        return;
      }
      pLVar9 = create_layer(0x1d);
      ParamDict::ParamDict(&local_c8);
      ParamDict::set(&local_c8,0,this->c);
      ParamDict::set(&local_c8,1,1);
      (*pLVar9->_vptr_Layer[2])(pLVar9,&local_c8);
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      local_30 = 0;
      local_70 = (void *)0x0;
      uStack_68 = 0;
      uStack_64 = 0;
      local_60 = 0;
      uStack_5c = 0;
      local_58 = 0;
      local_50 = (Allocator *)0x0;
      iStack_48 = 0;
      iStack_44 = 0;
      iStack_40 = 0;
      uStack_3c = 0;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      local_b8.data = local_118.data;
      local_b8.refcount._0_4_ = local_118.refcount._0_4_;
      local_b8.refcount._4_4_ = local_118.refcount._4_4_;
      local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
      local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
      local_b8.elempack = local_118.elempack;
      local_b8.allocator = local_118.allocator;
      local_b8.dims = local_118.dims;
      local_b8.w = local_118.w;
      local_b8.h = local_118.h;
      uVar8._0_4_ = local_118.d;
      uVar8._4_4_ = local_118.c;
      local_b8.d = local_118.d;
      local_b8.c = local_118.c;
      local_b8.cstep = local_118.cstep;
      uVar7 = uVar8;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        uVar7 = local_b8._52_8_;
        if (*piVar3 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              local_b8._52_8_ = uVar8;
              free(local_118.data);
              uVar7 = local_b8._52_8_;
            }
          }
          else {
            local_b8._52_8_ = uVar8;
            (*(local_118.allocator)->_vptr_Allocator[3])();
            uVar7 = local_b8._52_8_;
          }
        }
      }
      local_b8._52_8_ = uVar7;
      local_118.cstep = 0;
      local_118.data = (void *)0x0;
      local_118.refcount._0_4_ = 0;
      local_118.refcount._4_4_ = 0;
      local_118.elemsize._0_4_ = 0;
      local_118.elemsize._4_4_ = 0;
      local_118.elempack = 0;
      local_118.allocator = (Allocator *)0x0;
      local_118.dims = 0;
      local_118.w = 0;
      local_118.h = 0;
      local_118.d = 0;
      local_118.c = 0;
      create(&local_118,this->c,4,(Allocator *)0x0);
      piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (int *)CONCAT44(uStack_64,uStack_68);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_50 == (Allocator *)0x0) {
            if (local_70 != (void *)0x0) {
              free(local_70);
            }
          }
          else {
            (**(code **)(*(long *)local_50 + 0x18))();
          }
        }
      }
      piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
      local_70 = local_118.data;
      uStack_68 = local_118.refcount._0_4_;
      uStack_64 = local_118.refcount._4_4_;
      local_60 = (undefined4)local_118.elemsize;
      uStack_5c = local_118.elemsize._4_4_;
      local_58 = local_118.elempack;
      local_50 = local_118.allocator;
      iStack_48 = local_118.dims;
      iStack_44 = local_118.w;
      iStack_40 = local_118.h;
      uVar6._0_4_ = local_118.d;
      uVar6._4_4_ = local_118.c;
      uStack_3c._0_4_ = local_118.d;
      uStack_3c._4_4_ = local_118.c;
      local_30 = local_118.cstep;
      uVar7 = uVar6;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        uVar7 = uStack_3c;
        if (*piVar3 == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              uStack_3c = uVar6;
              free(local_118.data);
              uVar7 = uStack_3c;
            }
          }
          else {
            uStack_3c = uVar6;
            (*(local_118.allocator)->_vptr_Allocator[3])();
            uVar7 = uStack_3c;
          }
        }
      }
      uStack_3c = uVar7;
      iVar2 = this->c;
      if (0 < (long)iVar2) {
        lVar10 = 0;
        do {
          fVar1 = norm_vals[lVar10];
          *(float *)((long)local_b8.data + lVar10 * 4) = fVar1;
          *(float *)((long)local_70 + lVar10 * 4) = -mean_vals[lVar10] * fVar1;
          lVar10 = lVar10 + 1;
        } while (iVar2 != lVar10);
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_118);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
      lVar10 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_b8.refcount + lVar10);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            __ptr = *(void **)((long)&local_b8.data + lVar10);
            plVar4 = *(long **)((long)&local_b8.allocator + lVar10);
            if (plVar4 == (long *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_b8.cstep + lVar10) = 0;
        *(undefined8 *)((long)&local_b8.refcount + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_b8.elemsize + lVar10 + 4) = 0;
        *(undefined8 *)((long)&local_b8.data + lVar10) = 0;
        *(undefined8 *)((long)&local_b8.refcount + lVar10) = 0;
        *(undefined8 *)((long)&local_b8.dims + lVar10) = 0;
        *(undefined8 *)((long)&local_b8.h + lVar10) = 0;
        *(undefined4 *)((long)&local_b8.c + lVar10) = 0;
        lVar10 = lVar10 + -0x48;
      } while (lVar10 != -0x48);
      goto LAB_0015aa3d;
    }
    pLVar9 = create_layer(0x1d);
    ParamDict::ParamDict(&local_c8);
    ParamDict::set(&local_c8,0,this->c);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&local_c8);
    local_b8.cstep = 0;
    local_b8.data = (void *)0x0;
    local_b8.refcount._0_4_ = 0;
    local_b8.refcount._4_4_ = 0;
    local_b8.elemsize._0_4_ = 0;
    local_b8.elemsize._4_4_ = 0;
    local_b8.elempack = 0;
    local_b8.allocator = (Allocator *)0x0;
    local_b8.dims = 0;
    local_b8.w = 0;
    local_b8.h = 0;
    local_b8.d = 0;
    local_b8.c = 0;
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    create(&local_118,this->c,4,(Allocator *)0x0);
    piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          if (local_b8.data != (void *)0x0) {
            free(local_b8.data);
          }
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    local_b8.data = local_118.data;
    local_b8.refcount._0_4_ = local_118.refcount._0_4_;
    local_b8.refcount._4_4_ = local_118.refcount._4_4_;
    local_b8.elemsize._0_4_ = (undefined4)local_118.elemsize;
    local_b8.elemsize._4_4_ = local_118.elemsize._4_4_;
    local_b8.elempack = local_118.elempack;
    local_b8.allocator = local_118.allocator;
    local_b8.dims = local_118.dims;
    local_b8.w = local_118.w;
    local_b8.h = local_118.h;
    uVar5._0_4_ = local_118.d;
    uVar5._4_4_ = local_118.c;
    local_b8.d = local_118.d;
    local_b8.c = local_118.c;
    local_b8.cstep = local_118.cstep;
    uVar7 = uVar5;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      uVar7 = local_b8._52_8_;
      if (*piVar3 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            local_b8._52_8_ = uVar5;
            free(local_118.data);
            uVar7 = local_b8._52_8_;
          }
        }
        else {
          local_b8._52_8_ = uVar5;
          (*(local_118.allocator)->_vptr_Allocator[3])();
          uVar7 = local_b8._52_8_;
        }
      }
    }
    local_b8._52_8_ = uVar7;
    iVar2 = this->c;
    if (0 < (long)iVar2) {
      lVar10 = 0;
      do {
        *(float *)((long)local_b8.data + lVar10 * 4) = norm_vals[lVar10];
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_118,&local_b8);
    (*pLVar9->_vptr_Layer[3])(pLVar9,&local_118);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_118);
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    if (piVar3 == (int *)0x0) goto LAB_0015aa3d;
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) goto LAB_0015aa3d;
    if (local_b8.allocator != (Allocator *)0x0) {
      (*(local_b8.allocator)->_vptr_Allocator[3])();
      goto LAB_0015aa3d;
    }
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
LAB_0015aa3d:
  ParamDict::~ParamDict(&local_c8);
  Option::Option((Option *)&local_b8);
  local_b8.data = (void *)CONCAT44(1,local_b8.data._0_4_);
  (*pLVar9->_vptr_Layer[4])(pLVar9,&local_b8);
  (*pLVar9->_vptr_Layer[9])(pLVar9,this,&local_b8);
  (*pLVar9->_vptr_Layer[5])(pLVar9,&local_b8);
  (*pLVar9->_vptr_Layer[1])(pLVar9);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q = 0; q < c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = -mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1; // TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}